

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

size_t __thiscall bloaty::Options::ByteSizeLong(Options *this)

{
  Rep *pRVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Type *pTVar6;
  size_t sVar7;
  uint uVar8;
  int n;
  void **ppvVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  uVar5 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
  uVar11 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->filename_).super_RepeatedPtrFieldBase,uVar8);
      uVar4 = (uint)pTVar6->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar11 = uVar11 + pTVar6->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  uVar5 = (this->base_filename_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = uVar11 + uVar5;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->base_filename_).super_RepeatedPtrFieldBase,uVar8);
      uVar4 = (uint)pTVar6->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + pTVar6->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  uVar5 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->data_source_).super_RepeatedPtrFieldBase,uVar8);
      uVar4 = (uint)pTVar6->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + pTVar6->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  lVar13 = (long)(this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + lVar13;
  pRVar1 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar13 != 0) {
    lVar10 = 0;
    do {
      sVar7 = CustomDataSource::ByteSizeLong(*(CustomDataSource **)((long)ppvVar9 + lVar10));
      uVar5 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar13 * 8 != lVar10);
  }
  uVar5 = (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->debug_filename_).super_RepeatedPtrFieldBase,uVar8);
      uVar4 = (uint)pTVar6->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + pTVar6->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  uVar5 = (this->source_map_).super_RepeatedPtrFieldBase.current_size_;
  sVar7 = lVar12 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->source_map_).super_RepeatedPtrFieldBase,uVar8);
      uVar4 = (uint)pTVar6->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + pTVar6->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->disassemble_function_).ptr_)->_M_string_length;
      uVar8 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar2 = ((this->source_filter_).ptr_)->_M_string_length;
      uVar8 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 4) != 0) {
      if (this->demangle_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar8 = this->demangle_ | 1;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar11 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar11;
    }
    if ((uVar5 & 8) != 0) {
      if (this->sort_by_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar8 = this->sort_by_ | 1;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar11 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar11;
    }
    if ((uVar5 & 0x10) != 0) {
      if (this->verbose_level_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar8 = this->verbose_level_ | 1;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar11 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar11;
    }
    sVar7 = (uVar5 >> 4 & 2) + sVar7;
    if ((uVar5 & 0x40) != 0) {
      uVar11 = this->debug_vmaddr_ | 1;
      lVar12 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar12 * 9 + 0x49U >> 6) + 1;
    }
    if ((char)uVar5 < '\0') {
      uVar11 = this->debug_fileoff_ | 1;
      lVar12 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar12 * 9 + 0x49U >> 6) + 1;
    }
  }
  if ((uVar5 >> 8 & 1) != 0) {
    uVar11 = this->max_rows_per_level_ | 1;
    lVar12 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar7 = sVar7 + ((int)lVar12 * 9 + 0x49U >> 6) + 1;
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    sVar7 = google::protobuf::internal::ComputeUnknownFieldsSize
                      (&this->_internal_metadata_,sVar7,&this->_cached_size_);
    return sVar7;
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar7;
  return sVar7;
}

Assistant:

size_t Options::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:bloaty.Options)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string filename = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(filename_.size());
  for (int i = 0, n = filename_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      filename_.Get(i));
  }

  // repeated string base_filename = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(base_filename_.size());
  for (int i = 0, n = base_filename_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      base_filename_.Get(i));
  }

  // repeated string data_source = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(data_source_.size());
  for (int i = 0, n = data_source_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      data_source_.Get(i));
  }

  // repeated .bloaty.CustomDataSource custom_data_source = 8;
  total_size += 1UL * this->_internal_custom_data_source_size();
  for (const auto& msg : this->custom_data_source_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string debug_filename = 10;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(debug_filename_.size());
  for (int i = 0, n = debug_filename_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      debug_filename_.Get(i));
  }

  // repeated string source_map = 15;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(source_map_.size());
  for (int i = 0, n = source_map_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      source_map_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string disassemble_function = 9;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_disassemble_function());
    }

    // optional string source_filter = 13;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_source_filter());
    }

    // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_demangle());
    }

    // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_sort_by());
    }

    // optional int32 verbose_level = 7;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_verbose_level());
    }

    // optional bool dump_raw_map = 14;
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

    // optional uint64 debug_vmaddr = 11;
    if (cached_has_bits & 0x00000040u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_debug_vmaddr());
    }

    // optional uint64 debug_fileoff = 12;
    if (cached_has_bits & 0x00000080u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_debug_fileoff());
    }

  }
  // optional int64 max_rows_per_level = 4 [default = 20];
  if (cached_has_bits & 0x00000100u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
        this->_internal_max_rows_per_level());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}